

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O3

void __thiscall ImportSource_addToImporter_Test::TestBody(ImportSource_addToImporter_Test *this)

{
  element_type *peVar1;
  char cVar2;
  char *pcVar3;
  ImportSourcePtr imp3;
  ImportSourcePtr imp2;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar;
  ImporterPtr importer;
  ImportSourcePtr imp1;
  string url1;
  shared_ptr<libcellml::ImportSource> local_b8;
  shared_ptr<libcellml::ImportSource> local_a8;
  shared_ptr<libcellml::ImportSource> local_98;
  long *local_88;
  AssertionResult local_80;
  long local_70 [2];
  shared_ptr *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  AssertHelper local_50 [8];
  shared_ptr<libcellml::ImportSource> local_48;
  long *local_38 [2];
  long local_28 [2];
  
  libcellml::Importer::create(SUB81(&local_60,0));
  libcellml::ImportSource::create();
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"http://www.example.com#hello","");
  libcellml::ImportSource::setUrl
            ((string *)
             local_48.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  cVar2 = libcellml::Importer::addImportSource(local_60);
  local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._1_7_,cVar2);
  local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_a8,"importer->addImportSource(imp1)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x2d,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_b8.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Importer::importSourceCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"size_t(1)","importer->importSourceCount()",
             (unsigned_long *)&local_a8,(unsigned_long *)&local_b8);
  if ((internal)local_80.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_a8.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Importer::importSource((ulong)&local_a8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
            ((internal *)&local_80,"imp1","importer->importSource(0)",&local_48,&local_a8);
  if (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((internal)local_80.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_a8.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar2 = libcellml::Importer::addImportSource(local_60);
  local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,cVar2) ^ 1);
  local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_a8,"importer->addImportSource(imp1)","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x32,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_b8.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Importer::importSourceCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"size_t(1)","importer->importSourceCount()",
             (unsigned_long *)&local_a8,(unsigned_long *)&local_b8);
  if ((internal)local_80.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_a8.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Importer::importSource((ulong)&local_a8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
            ((internal *)&local_80,"imp1","importer->importSource(0)",&local_48,&local_a8);
  if (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((internal)local_80.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_a8.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::ImportSource::create();
  libcellml::ImportSource::setUrl
            ((string *)
             local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  cVar2 = libcellml::Importer::addImportSource(local_60);
  local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._1_7_,cVar2);
  local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_b8,"importer->addImportSource(imp2)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x3a,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_98.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x2;
  local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Importer::importSourceCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"size_t(2)","importer->importSourceCount()",
             (unsigned_long *)&local_b8,(unsigned_long *)&local_98);
  if ((internal)local_80.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_b8.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Importer::importSource((ulong)&local_b8);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
            ((internal *)&local_80,"imp2","importer->importSource(1)",&local_a8,&local_b8);
  if (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((internal)local_80.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_b8.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::ImportSource::create();
  peVar1 = local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"http://www.example.com#bonjour","");
  libcellml::ImportSource::setUrl((string *)peVar1);
  if ((long *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  cVar2 = libcellml::Importer::addImportSource(local_60);
  local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._1_7_,cVar2);
  local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(char *)&local_98,"importer->addImportSource(imp3)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x43,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(local_50,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    if ((long *)local_80._0_8_ != local_70) {
      operator_delete((void *)local_80._0_8_,local_70[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3;
  local_88 = (long *)libcellml::Importer::importSourceCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"size_t(3)","importer->importSourceCount()",
             (unsigned_long *)&local_98,(unsigned_long *)&local_88);
  if ((internal)local_80.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_98.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Importer::importSource((ulong)&local_98);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
            ((internal *)&local_80,"imp3","importer->importSource(2)",&local_b8,&local_98);
  if (local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((internal)local_80.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') &&
         (local_98.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        (**(code **)(*(long *)local_98.
                              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (local_48.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

TEST(ImportSource, addToImporter)
{
    auto importer = libcellml::Importer::create();

    // Add import source to importer:
    auto imp1 = libcellml::ImportSource::create();
    std::string url1 = "http://www.example.com#hello";
    imp1->setUrl(url1);

    EXPECT_TRUE(importer->addImportSource(imp1));
    EXPECT_EQ(size_t(1), importer->importSourceCount());
    EXPECT_EQ(imp1, importer->importSource(0));

    // Add the same one again:
    EXPECT_FALSE(importer->addImportSource(imp1));
    EXPECT_EQ(size_t(1), importer->importSourceCount());
    EXPECT_EQ(imp1, importer->importSource(0));

    // Add another with the same URL:
    auto imp2 = libcellml::ImportSource::create();
    imp2->setUrl(url1);

    EXPECT_TRUE(importer->addImportSource(imp2));
    EXPECT_EQ(size_t(2), importer->importSourceCount());
    EXPECT_EQ(imp2, importer->importSource(1));

    // Add another with a new URL:
    auto imp3 = libcellml::ImportSource::create();
    auto url3 = "http://www.example.com#bonjour";
    imp3->setUrl(url3);

    EXPECT_TRUE(importer->addImportSource(imp3));
    EXPECT_EQ(size_t(3), importer->importSourceCount());
    EXPECT_EQ(imp3, importer->importSource(2));
}